

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestDateTime::testDateTime(TestDateTime *this)

{
  uint uVar1;
  Type *pTVar2;
  long lVar3;
  bool bVar4;
  char cVar5;
  QTime QVar6;
  int iVar7;
  QDate QVar8;
  undefined8 uVar9;
  int iVar10;
  QPoint pos;
  QPoint pos_00;
  QPoint pos_01;
  QPoint pos_02;
  QPoint pos_03;
  QPoint pos_04;
  int iVar11;
  double local_158;
  double local_150;
  undefined1 local_148 [16];
  qsizetype local_138;
  double local_130;
  double local_128;
  QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
  local_120;
  QMouseEvent me;
  QDateTime dt;
  QTime local_bc;
  QTime local_b8;
  QTime local_b4;
  QTime local_b0;
  QTime local_ac;
  QTime local_a8;
  QTime local_a4;
  QTime local_a0;
  QTime local_9c;
  QTime local_98;
  QTime local_94;
  QDate local_90;
  QDate local_88;
  QDate local_80;
  QDate local_78;
  QDate local_70;
  QDate local_68;
  QDate local_60;
  QDate local_58;
  QDate local_50;
  QDate local_48;
  QDate local_40;
  QTime local_34;
  QDate local_30;
  
  QWidget::show();
  bVar4 = (bool)QTest::qWaitForWindowActive(&((this->m_dt).value)->super_QWidget,5000);
  cVar5 = QTest::qVerify(bVar4,"QTest::qWaitForWindowActive( m_dt.data() )","",
                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                         ,0x98);
  if (cVar5 != '\0') {
    QtMWidgets::DateTimePicker::dateTime((DateTimePicker *)&me);
    QDate::QDate(&local_40,2000,1,1);
    QTime::QTime(&local_94,0,0,0,0);
    QDateTime::QDateTime((QDateTime *)local_148,local_40,local_94,LocalTime,0);
    bVar4 = (bool)QDateTime::equals((QDateTime *)&me);
    cVar5 = QTest::qVerify(bVar4,
                           "m_dt->dateTime() == QDateTime( DATETIMEPICKER_DATE_INITIAL, DATETIMEPICKER_TIME_MIN )"
                           ,"",
                           "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                           ,0x9b);
    QDateTime::~QDateTime((QDateTime *)local_148);
    QDateTime::~QDateTime((QDateTime *)&me);
    if (cVar5 != '\0') {
      QDate::QDate(&local_30,0x7e4,10,0x18);
      QTime::QTime(&local_34,0xd,0xc,0,0);
      QDateTime::QDateTime(&dt,local_30,local_34,LocalTime,0);
      QtMWidgets::DateTimePicker::setDateTime((this->m_dt).value,&dt);
      QVar8 = QtMWidgets::DateTimePicker::minimumDate((this->m_dt).value);
      QDate::QDate(&local_48,0x6d8,9,0xe);
      cVar5 = QTest::qVerify(QVar8.jd == local_48.jd,
                             "m_dt->minimumDate() == DATETIMEPICKER_COMPAT_DATE_MIN","",
                             "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                             ,0xa0);
      if (cVar5 != '\0') {
        QVar8 = QtMWidgets::DateTimePicker::maximumDate((this->m_dt).value);
        QDate::QDate(&local_50,7999,0xc,0x1f);
        cVar5 = QTest::qVerify(QVar8.jd == local_50.jd,
                               "m_dt->maximumDate() == DATETIMEPICKER_DATE_MAX","",
                               "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                               ,0xa1);
        if (cVar5 != '\0') {
          QVar6 = QtMWidgets::DateTimePicker::minimumTime((this->m_dt).value);
          QTime::QTime(&local_98,0,0,0,0);
          cVar5 = QTest::qVerify(QVar6.mds == local_98.mds,
                                 "m_dt->minimumTime() == DATETIMEPICKER_TIME_MIN","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                 ,0xa2);
          if (cVar5 != '\0') {
            QVar6 = QtMWidgets::DateTimePicker::maximumTime((this->m_dt).value);
            QTime::QTime(&local_9c,0x17,0x3b,0x3b,999);
            cVar5 = QTest::qVerify(QVar6.mds == local_9c.mds,
                                   "m_dt->maximumTime() == DATETIMEPICKER_TIME_MAX","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                   ,0xa3);
            if (cVar5 != '\0') {
              QtMWidgets::DateTimePicker::minimumDateTime((DateTimePicker *)&me);
              QDate::QDate(&local_58,0x6d8,9,0xe);
              QTime::QTime(&local_a0,0,0,0,0);
              QDateTime::QDateTime((QDateTime *)local_148,local_58,local_a0,LocalTime,0);
              bVar4 = (bool)QDateTime::equals((QDateTime *)&me);
              cVar5 = QTest::qVerify(bVar4,
                                     "m_dt->minimumDateTime() == DATETIMEPICKER_COMPAT_DATETIME_MIN"
                                     ,"",
                                     "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                     ,0xa4);
              QDateTime::~QDateTime((QDateTime *)local_148);
              QDateTime::~QDateTime((QDateTime *)&me);
              if (cVar5 != '\0') {
                QtMWidgets::DateTimePicker::maximumDateTime((DateTimePicker *)&me);
                QDate::QDate(&local_60,7999,0xc,0x1f);
                QTime::QTime(&local_a4,0x17,0x3b,0x3b,999);
                QDateTime::QDateTime((QDateTime *)local_148,local_60,local_a4,LocalTime,0);
                bVar4 = (bool)QDateTime::equals((QDateTime *)&me);
                cVar5 = QTest::qVerify(bVar4,
                                       "m_dt->maximumDateTime() == DATETIMEPICKER_DATETIME_MAX","",
                                       "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                       ,0xa5);
                QDateTime::~QDateTime((QDateTime *)local_148);
                QDateTime::~QDateTime((QDateTime *)&me);
                if (cVar5 != '\0') {
                  QtMWidgets::DateTimePicker::dateTime((DateTimePicker *)&me);
                  bVar4 = (bool)QDateTime::equals((QDateTime *)&me);
                  cVar5 = QTest::qVerify(bVar4,"m_dt->dateTime() == dt","",
                                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                         ,0xa7);
                  QDateTime::~QDateTime((QDateTime *)&me);
                  if (cVar5 != '\0') {
                    QWidget::update();
                    QTest::qWait(500);
                    pTVar2 = (this->m_dt).value;
                    uVar1 = *(this->m_dtSections).d.ptr;
                    lVar3 = *(long *)&pTVar2->field_0x20;
                    lVar3 = (long)((*(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18)) + 1) / 2;
                    QTest::mousePress(&pTVar2->super_QWidget,LeftButton,(KeyboardModifiers)0x0,
                                      (QPoint)(lVar3 << 0x20 | (ulong)uVar1),0x14);
                    iVar7 = (this->m_delta).xp + uVar1;
                    iVar11 = (int)lVar3;
                    iVar10 = (this->m_delta).yp + iVar11;
                    local_158 = (double)iVar7;
                    local_150 = (double)iVar10;
                    local_120.d = (DateTimePickerPrivate *)CONCAT44(iVar10,iVar7);
                    uVar9 = QWidget::mapToGlobal((QPoint *)(this->m_dt).value);
                    local_130 = (double)(int)uVar9;
                    local_128 = (double)(int)((ulong)uVar9 >> 0x20);
                    local_148._0_8_ = (Data *)0x0;
                    local_148._8_8_ = (char16_t *)0x0;
                    local_138 = 0;
                    uVar9 = QPointingDevice::primaryPointingDevice((QString *)local_148);
                    QMouseEvent::QMouseEvent(&me,5,&local_158,&local_130,1,1,0,uVar9);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)local_148);
                    QCoreApplication::sendEvent((QObject *)(this->m_dt).value,(QEvent *)&me);
                    QTest::qWait(500);
                    pos.xp = uVar1 + (this->m_delta).xp;
                    pos.yp = iVar11 + (this->m_delta).yp;
                    QTest::mouseRelease(&((this->m_dt).value)->super_QWidget,LeftButton,
                                        (KeyboardModifiers)0x0,pos,0x14);
                    QTest::qWait(500);
                    QtMWidgets::DateTimePicker::dateTime((DateTimePicker *)local_148);
                    QDate::QDate(&local_68,0x7e4,10,0x19);
                    QTime::QTime(&local_a8,0xd,0xc,0,0);
                    QDateTime::QDateTime((QDateTime *)&local_158,local_68,local_a8,LocalTime,0);
                    bVar4 = (bool)QDateTime::equals((QDateTime *)local_148);
                    cVar5 = QTest::qVerify(bVar4,
                                           "m_dt->dateTime() == QDateTime( { 2020, 10, 25 }, { 13, 12 } )"
                                           ,"",
                                           "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                           ,0xb8);
                    QDateTime::~QDateTime((QDateTime *)&local_158);
                    QDateTime::~QDateTime((QDateTime *)local_148);
                    QMouseEvent::~QMouseEvent(&me);
                    if (cVar5 != '\0') {
                      pTVar2 = (this->m_dt).value;
                      uVar1 = (this->m_dtSections).d.ptr[1];
                      lVar3 = *(long *)&pTVar2->field_0x20;
                      lVar3 = (long)((*(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18)) + 1) / 2;
                      QTest::mousePress(&pTVar2->super_QWidget,LeftButton,(KeyboardModifiers)0x0,
                                        (QPoint)(lVar3 << 0x20 | (ulong)uVar1),0x14);
                      iVar7 = (this->m_delta).xp + uVar1;
                      iVar11 = (int)lVar3;
                      iVar10 = (this->m_delta).yp + iVar11;
                      local_158 = (double)iVar7;
                      local_150 = (double)iVar10;
                      local_120.d = (DateTimePickerPrivate *)CONCAT44(iVar10,iVar7);
                      uVar9 = QWidget::mapToGlobal((QPoint *)(this->m_dt).value);
                      local_130 = (double)(int)uVar9;
                      local_128 = (double)(int)((ulong)uVar9 >> 0x20);
                      local_148._0_8_ = (Data *)0x0;
                      local_148._8_8_ = (char16_t *)0x0;
                      local_138 = 0;
                      uVar9 = QPointingDevice::primaryPointingDevice((QString *)local_148);
                      QMouseEvent::QMouseEvent(&me,5,&local_158,&local_130,1,1,0,uVar9);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)local_148);
                      QCoreApplication::sendEvent((QObject *)(this->m_dt).value,(QEvent *)&me);
                      QTest::qWait(500);
                      pos_00.xp = uVar1 + (this->m_delta).xp;
                      pos_00.yp = iVar11 + (this->m_delta).yp;
                      QTest::mouseRelease(&((this->m_dt).value)->super_QWidget,LeftButton,
                                          (KeyboardModifiers)0x0,pos_00,0x14);
                      QTest::qWait(500);
                      QtMWidgets::DateTimePicker::dateTime((DateTimePicker *)local_148);
                      QDate::QDate(&local_70,0x7e4,0xb,0x19);
                      QTime::QTime(&local_ac,0xd,0xc,0,0);
                      QDateTime::QDateTime((QDateTime *)&local_158,local_70,local_ac,LocalTime,0);
                      bVar4 = (bool)QDateTime::equals((QDateTime *)local_148);
                      cVar5 = QTest::qVerify(bVar4,
                                             "m_dt->dateTime() == QDateTime( { 2020, 11, 25 }, { 13, 12 } )"
                                             ,"",
                                             "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                             ,0xc6);
                      QDateTime::~QDateTime((QDateTime *)&local_158);
                      QDateTime::~QDateTime((QDateTime *)local_148);
                      QMouseEvent::~QMouseEvent(&me);
                      if (cVar5 != '\0') {
                        pTVar2 = (this->m_dt).value;
                        uVar1 = (this->m_dtSections).d.ptr[2];
                        lVar3 = *(long *)&pTVar2->field_0x20;
                        lVar3 = (long)((*(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18)) + 1) / 2;
                        QTest::mousePress(&pTVar2->super_QWidget,LeftButton,(KeyboardModifiers)0x0,
                                          (QPoint)(lVar3 << 0x20 | (ulong)uVar1),0x14);
                        iVar7 = (this->m_delta).xp + uVar1;
                        iVar11 = (int)lVar3;
                        iVar10 = (this->m_delta).yp + iVar11;
                        local_158 = (double)iVar7;
                        local_150 = (double)iVar10;
                        local_120.d = (DateTimePickerPrivate *)CONCAT44(iVar10,iVar7);
                        uVar9 = QWidget::mapToGlobal((QPoint *)(this->m_dt).value);
                        local_130 = (double)(int)uVar9;
                        local_128 = (double)(int)((ulong)uVar9 >> 0x20);
                        local_148._0_8_ = (Data *)0x0;
                        local_148._8_8_ = (char16_t *)0x0;
                        local_138 = 0;
                        uVar9 = QPointingDevice::primaryPointingDevice((QString *)local_148);
                        QMouseEvent::QMouseEvent(&me,5,&local_158,&local_130,1,1,0,uVar9);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer
                                  ((QArrayDataPointer<char16_t> *)local_148);
                        QCoreApplication::sendEvent((QObject *)(this->m_dt).value,(QEvent *)&me);
                        QTest::qWait(500);
                        pos_01.xp = uVar1 + (this->m_delta).xp;
                        pos_01.yp = iVar11 + (this->m_delta).yp;
                        QTest::mouseRelease(&((this->m_dt).value)->super_QWidget,LeftButton,
                                            (KeyboardModifiers)0x0,pos_01,0x14);
                        QTest::qWait(500);
                        QtMWidgets::DateTimePicker::dateTime((DateTimePicker *)local_148);
                        QDate::QDate(&local_78,0x7e5,0xb,0x19);
                        QTime::QTime(&local_b0,0xd,0xc,0,0);
                        QDateTime::QDateTime((QDateTime *)&local_158,local_78,local_b0,LocalTime,0);
                        bVar4 = (bool)QDateTime::equals((QDateTime *)local_148);
                        cVar5 = QTest::qVerify(bVar4,
                                               "m_dt->dateTime() == QDateTime( { 2021, 11, 25 }, { 13, 12 } )"
                                               ,"",
                                               "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                               ,0xd5);
                        QDateTime::~QDateTime((QDateTime *)&local_158);
                        QDateTime::~QDateTime((QDateTime *)local_148);
                        QMouseEvent::~QMouseEvent(&me);
                        if (cVar5 != '\0') {
                          pTVar2 = (this->m_dt).value;
                          uVar1 = (this->m_dtSections).d.ptr[3];
                          lVar3 = *(long *)&pTVar2->field_0x20;
                          lVar3 = (long)((*(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18)) + 1) / 2;
                          QTest::mousePress(&pTVar2->super_QWidget,LeftButton,(KeyboardModifiers)0x0
                                            ,(QPoint)(lVar3 << 0x20 | (ulong)uVar1),0x14);
                          iVar7 = (this->m_delta).xp + uVar1;
                          iVar11 = (int)lVar3;
                          iVar10 = (this->m_delta).yp + iVar11;
                          local_158 = (double)iVar7;
                          local_150 = (double)iVar10;
                          local_120.d = (DateTimePickerPrivate *)CONCAT44(iVar10,iVar7);
                          uVar9 = QWidget::mapToGlobal((QPoint *)(this->m_dt).value);
                          local_130 = (double)(int)uVar9;
                          local_128 = (double)(int)((ulong)uVar9 >> 0x20);
                          local_148._0_8_ = (Data *)0x0;
                          local_148._8_8_ = (char16_t *)0x0;
                          local_138 = 0;
                          uVar9 = QPointingDevice::primaryPointingDevice((QString *)local_148);
                          QMouseEvent::QMouseEvent(&me,5,&local_158,&local_130,1,1,0,uVar9);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer
                                    ((QArrayDataPointer<char16_t> *)local_148);
                          QCoreApplication::sendEvent((QObject *)(this->m_dt).value,(QEvent *)&me);
                          QTest::qWait(500);
                          pos_02.xp = uVar1 + (this->m_delta).xp;
                          pos_02.yp = iVar11 + (this->m_delta).yp;
                          QTest::mouseRelease(&((this->m_dt).value)->super_QWidget,LeftButton,
                                              (KeyboardModifiers)0x0,pos_02,0x14);
                          QTest::qWait(500);
                          QtMWidgets::DateTimePicker::dateTime((DateTimePicker *)local_148);
                          QDate::QDate(&local_80,0x7e5,0xb,0x19);
                          QTime::QTime(&local_b4,0xe,0xc,0,0);
                          QDateTime::QDateTime
                                    ((QDateTime *)&local_158,local_80,local_b4,LocalTime,0);
                          bVar4 = (bool)QDateTime::equals((QDateTime *)local_148);
                          cVar5 = QTest::qVerify(bVar4,
                                                 "m_dt->dateTime() == QDateTime( { 2021, 11, 25 }, { 14, 12 } )"
                                                 ,"",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                                 ,0xe4);
                          QDateTime::~QDateTime((QDateTime *)&local_158);
                          QDateTime::~QDateTime((QDateTime *)local_148);
                          QMouseEvent::~QMouseEvent(&me);
                          if (cVar5 != '\0') {
                            pTVar2 = (this->m_dt).value;
                            uVar1 = (this->m_dtSections).d.ptr[4];
                            lVar3 = *(long *)&pTVar2->field_0x20;
                            lVar3 = (long)((*(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18)) + 1) /
                                    2;
                            QTest::mousePress(&pTVar2->super_QWidget,LeftButton,
                                              (KeyboardModifiers)0x0,
                                              (QPoint)(lVar3 << 0x20 | (ulong)uVar1),0x14);
                            iVar7 = (this->m_delta).xp + uVar1;
                            iVar11 = (int)lVar3;
                            iVar10 = (this->m_delta).yp + iVar11;
                            local_158 = (double)iVar7;
                            local_150 = (double)iVar10;
                            local_120.d = (DateTimePickerPrivate *)CONCAT44(iVar10,iVar7);
                            uVar9 = QWidget::mapToGlobal((QPoint *)(this->m_dt).value);
                            local_130 = (double)(int)uVar9;
                            local_128 = (double)(int)((ulong)uVar9 >> 0x20);
                            local_148._0_8_ = (Data *)0x0;
                            local_148._8_8_ = (char16_t *)0x0;
                            local_138 = 0;
                            uVar9 = QPointingDevice::primaryPointingDevice((QString *)local_148);
                            QMouseEvent::QMouseEvent(&me,5,&local_158,&local_130,1,1,0,uVar9);
                            QArrayDataPointer<char16_t>::~QArrayDataPointer
                                      ((QArrayDataPointer<char16_t> *)local_148);
                            QCoreApplication::sendEvent((QObject *)(this->m_dt).value,(QEvent *)&me)
                            ;
                            QTest::qWait(500);
                            pos_03.xp = uVar1 + (this->m_delta).xp;
                            pos_03.yp = iVar11 + (this->m_delta).yp;
                            QTest::mouseRelease(&((this->m_dt).value)->super_QWidget,LeftButton,
                                                (KeyboardModifiers)0x0,pos_03,0x14);
                            QTest::qWait(500);
                            QtMWidgets::DateTimePicker::dateTime((DateTimePicker *)local_148);
                            QDate::QDate(&local_88,0x7e5,0xb,0x19);
                            QTime::QTime(&local_b8,0xe,0xd,0,0);
                            QDateTime::QDateTime
                                      ((QDateTime *)&local_158,local_88,local_b8,LocalTime,0);
                            bVar4 = (bool)QDateTime::equals((QDateTime *)local_148);
                            cVar5 = QTest::qVerify(bVar4,
                                                  "m_dt->dateTime() == QDateTime( { 2021, 11, 25 }, { 14, 13 } )"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                                  ,0xf3);
                            QDateTime::~QDateTime((QDateTime *)&local_158);
                            QDateTime::~QDateTime((QDateTime *)local_148);
                            QMouseEvent::~QMouseEvent(&me);
                            if (cVar5 != '\0') {
                              pTVar2 = (this->m_dt).value;
                              uVar1 = (this->m_dtSections).d.ptr[5];
                              lVar3 = *(long *)&pTVar2->field_0x20;
                              lVar3 = (long)((*(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18)) + 1)
                                      / 2;
                              QTest::mousePress(&pTVar2->super_QWidget,LeftButton,
                                                (KeyboardModifiers)0x0,
                                                (QPoint)(lVar3 << 0x20 | (ulong)uVar1),0x14);
                              iVar7 = uVar1 - (this->m_delta).xp;
                              iVar11 = (int)lVar3;
                              iVar10 = iVar11 - (this->m_delta).yp;
                              local_158 = (double)iVar7;
                              local_150 = (double)iVar10;
                              local_120.d = (DateTimePickerPrivate *)CONCAT44(iVar10,iVar7);
                              uVar9 = QWidget::mapToGlobal((QPoint *)(this->m_dt).value);
                              local_130 = (double)(int)uVar9;
                              local_128 = (double)(int)((ulong)uVar9 >> 0x20);
                              local_148._0_8_ = (Data *)0x0;
                              local_148._8_8_ = (char16_t *)0x0;
                              local_138 = 0;
                              uVar9 = QPointingDevice::primaryPointingDevice((QString *)local_148);
                              QMouseEvent::QMouseEvent(&me,5,&local_158,&local_130,1,1,0,uVar9);
                              QArrayDataPointer<char16_t>::~QArrayDataPointer
                                        ((QArrayDataPointer<char16_t> *)local_148);
                              QCoreApplication::sendEvent
                                        ((QObject *)(this->m_dt).value,(QEvent *)&me);
                              QTest::qWait(500);
                              pos_04.xp = uVar1 - (this->m_delta).xp;
                              pos_04.yp = iVar11 - (this->m_delta).yp;
                              QTest::mouseRelease(&((this->m_dt).value)->super_QWidget,LeftButton,
                                                  (KeyboardModifiers)0x0,pos_04,0x14);
                              QTest::qWait(500);
                              QtMWidgets::DateTimePicker::dateTime((DateTimePicker *)local_148);
                              QDate::QDate(&local_90,0x7e5,0xb,0x19);
                              QTime::QTime(&local_bc,2,0xd,0,0);
                              QDateTime::QDateTime
                                        ((QDateTime *)&local_158,local_90,local_bc,LocalTime,0);
                              bVar4 = (bool)QDateTime::equals((QDateTime *)local_148);
                              cVar5 = QTest::qVerify(bVar4,
                                                  "m_dt->dateTime() == QDateTime( { 2021, 11, 25 }, { 2, 13 } )"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                                  ,0x102);
                              QDateTime::~QDateTime((QDateTime *)&local_158);
                              QDateTime::~QDateTime((QDateTime *)local_148);
                              QMouseEvent::~QMouseEvent(&me);
                              if (cVar5 != '\0') {
                                QWidget::hide();
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      QDateTime::~QDateTime(&dt);
    }
  }
  return;
}

Assistant:

void testDateTime()
	{
		m_dt->show();

		QVERIFY( QTest::qWaitForWindowActive( m_dt.data() ) );

		QVERIFY( m_dt->dateTime() == QDateTime( DATETIMEPICKER_DATE_INITIAL,
			DATETIMEPICKER_TIME_MIN ) );

		const QDateTime dt = { { 2020, 10, 24 }, { 13, 12 } };
		m_dt->setDateTime( dt );

		QVERIFY( m_dt->minimumDate() == DATETIMEPICKER_COMPAT_DATE_MIN );
		QVERIFY( m_dt->maximumDate() == DATETIMEPICKER_DATE_MAX );
		QVERIFY( m_dt->minimumTime() == DATETIMEPICKER_TIME_MIN );
		QVERIFY( m_dt->maximumTime() == DATETIMEPICKER_TIME_MAX );
		QVERIFY( m_dt->minimumDateTime() == DATETIMEPICKER_COMPAT_DATETIME_MIN );
		QVERIFY( m_dt->maximumDateTime() == DATETIMEPICKER_DATETIME_MAX );

		QVERIFY( m_dt->dateTime() == dt );

		m_dt->update();

		QTest::qWait( 500 );

		{
			QPoint p( m_dtSections.at( 0 ), m_dt->height() / 2 );
			QTest::mousePress( m_dt.data(), Qt::LeftButton, {}, p, 20 );
			QMouseEvent me( QEvent::MouseMove, p + m_delta,
				m_dt->mapToGlobal( p + m_delta ),
				Qt::LeftButton, Qt::LeftButton, {} );
			QApplication::sendEvent( m_dt.data(), &me );
			QTest::qWait( 500 );
			QTest::mouseRelease( m_dt.data(), Qt::LeftButton, {}, p + m_delta, 20 );
			QTest::qWait( 500 );

			QVERIFY( m_dt->dateTime() == QDateTime( { 2020, 10, 25 }, { 13, 12 } ) );
		}

		{
			QPoint p( m_dtSections.at( 1 ), m_dt->height() / 2 );
			QTest::mousePress( m_dt.data(), Qt::LeftButton, {}, p, 20 );
			QMouseEvent me( QEvent::MouseMove, p + m_delta,
				m_dt->mapToGlobal( p + m_delta ),
				Qt::LeftButton, Qt::LeftButton, {} );
			QApplication::sendEvent( m_dt.data(), &me );
			QTest::qWait( 500 );
			QTest::mouseRelease( m_dt.data(), Qt::LeftButton, {}, p + m_delta, 20 );
			QTest::qWait( 500 );

			QVERIFY( m_dt->dateTime() == QDateTime( { 2020, 11, 25 }, { 13, 12 } ) );
		}

		{
			QPoint p( m_dtSections.at( 2 ), m_dt->height() / 2 );
			QTest::mousePress( m_dt.data(), Qt::LeftButton, {}, p, 20 );
			QMouseEvent me( QEvent::MouseMove, p + m_delta,
				m_dt->mapToGlobal( p + m_delta ),
				Qt::LeftButton, Qt::LeftButton, {} );
			QApplication::sendEvent( m_dt.data(), &me );
			QTest::qWait( 500 );
			QTest::mouseRelease( m_dt.data(), Qt::LeftButton, {}, p + m_delta, 20 );

			QTest::qWait( 500 );

			QVERIFY( m_dt->dateTime() == QDateTime( { 2021, 11, 25 }, { 13, 12 } ) );
		}

		{
			QPoint p( m_dtSections.at( 3 ), m_dt->height() / 2 );
			QTest::mousePress( m_dt.data(), Qt::LeftButton, {}, p, 20 );
			QMouseEvent me( QEvent::MouseMove, p + m_delta,
				m_dt->mapToGlobal( p + m_delta ),
				Qt::LeftButton, Qt::LeftButton, {} );
			QApplication::sendEvent( m_dt.data(), &me );
			QTest::qWait( 500 );
			QTest::mouseRelease( m_dt.data(), Qt::LeftButton, {}, p + m_delta, 20 );

			QTest::qWait( 500 );

			QVERIFY( m_dt->dateTime() == QDateTime( { 2021, 11, 25 }, { 14, 12 } ) );
		}

		{
			QPoint p( m_dtSections.at( 4 ), m_dt->height() / 2 );
			QTest::mousePress( m_dt.data(), Qt::LeftButton, {}, p, 20 );
			QMouseEvent me( QEvent::MouseMove, p + m_delta,
				m_dt->mapToGlobal( p + m_delta ),
				Qt::LeftButton, Qt::LeftButton, {} );
			QApplication::sendEvent( m_dt.data(), &me );
			QTest::qWait( 500 );
			QTest::mouseRelease( m_dt.data(), Qt::LeftButton, {}, p + m_delta, 20 );

			QTest::qWait( 500 );

			QVERIFY( m_dt->dateTime() == QDateTime( { 2021, 11, 25 }, { 14, 13 } ) );
		}

		{
			QPoint p( m_dtSections.at( 5 ), m_dt->height() / 2 );
			QTest::mousePress( m_dt.data(), Qt::LeftButton, {}, p, 20 );
			QMouseEvent me( QEvent::MouseMove, p - m_delta,
				m_dt->mapToGlobal( p - m_delta ),
				Qt::LeftButton, Qt::LeftButton, {} );
			QApplication::sendEvent( m_dt.data(), &me );
			QTest::qWait( 500 );
			QTest::mouseRelease( m_dt.data(), Qt::LeftButton, {}, p - m_delta, 20 );

			QTest::qWait( 500 );

			QVERIFY( m_dt->dateTime() == QDateTime( { 2021, 11, 25 }, { 2, 13 } ) );
		}

		m_dt->hide();
	}